

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_on_settings_received(nghttp2_session *session,nghttp2_frame *frame,int noack)

{
  nghttp2_settings_entry *pnVar1;
  nghttp2_inflight_settings *settings_00;
  int iVar2;
  int iVar3;
  nghttp2_settings_entry *entry;
  nghttp2_inflight_settings *settings;
  nghttp2_mem *mem;
  size_t i;
  int rv;
  int noack_local;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  if ((frame->hd).stream_id == 0) {
    if (((frame->hd).flags & 1) == 0) {
      if (session->remote_settings_received == '\0') {
        (session->remote_settings).max_concurrent_streams = 0xffffffff;
        session->remote_settings_received = '\x01';
      }
      for (mem = (nghttp2_mem *)0x0; mem < (nghttp2_mem *)(frame->data).padlen;
          mem = (nghttp2_mem *)((long)&mem->mem_user_data + 1)) {
        pnVar1 = (frame->settings).iv + (long)mem;
        switch(pnVar1->settings_id) {
        case 1:
          iVar2 = nghttp2_hd_deflate_change_table_size(&session->hd_deflater,(ulong)pnVar1->value);
          if (iVar2 != 0) {
            iVar3 = nghttp2_is_fatal(iVar2);
            if (iVar3 != 0) {
              return iVar2;
            }
            iVar2 = session_handle_invalid_connection(session,frame,-0x20b,(char *)0x0);
            return iVar2;
          }
          (session->remote_settings).header_table_size = pnVar1->value;
          break;
        case 2:
          if ((pnVar1->value != 0) && (pnVar1->value != 1)) {
            iVar2 = session_handle_invalid_connection
                              (session,frame,-0x1f9,"SETTINGS: invalid SETTINGS_ENBLE_PUSH");
            return iVar2;
          }
          if ((session->server == '\0') && (pnVar1->value != 0)) {
            iVar2 = session_handle_invalid_connection
                              (session,frame,-0x1f9,"SETTINGS: server attempted to enable push");
            return iVar2;
          }
          (session->remote_settings).enable_push = pnVar1->value;
          break;
        case 3:
          (session->remote_settings).max_concurrent_streams = pnVar1->value;
          break;
        case 4:
          if (0x7fffffff < pnVar1->value) {
            iVar2 = session_handle_invalid_connection
                              (session,frame,-0x20c,
                               "SETTINGS: too large SETTINGS_INITIAL_WINDOW_SIZE");
            return iVar2;
          }
          iVar2 = session_update_remote_initial_window_size(session,pnVar1->value);
          iVar3 = nghttp2_is_fatal(iVar2);
          if (iVar3 != 0) {
            return iVar2;
          }
          if (iVar2 != 0) {
            iVar2 = session_handle_invalid_connection(session,frame,-0x20c,(char *)0x0);
            return iVar2;
          }
          (session->remote_settings).initial_window_size = pnVar1->value;
          break;
        case 5:
          if ((pnVar1->value < 0x4000) || (0xffffff < pnVar1->value)) {
            iVar2 = session_handle_invalid_connection
                              (session,frame,-0x1f9,"SETTINGS: invalid SETTINGS_MAX_FRAME_SIZE");
            return iVar2;
          }
          (session->remote_settings).max_frame_size = pnVar1->value;
          break;
        case 6:
          (session->remote_settings).max_header_list_size = pnVar1->value;
          break;
        case 8:
          if ((pnVar1->value != 0) && (pnVar1->value != 1)) {
            iVar2 = session_handle_invalid_connection
                              (session,frame,-0x1f9,
                               "SETTINGS: invalid SETTINGS_ENABLE_CONNECT_PROTOCOL");
            return iVar2;
          }
          if (((session->server == '\0') &&
              ((session->remote_settings).enable_connect_protocol != 0)) && (pnVar1->value == 0)) {
            iVar2 = session_handle_invalid_connection
                              (session,frame,-0x1f9,
                               "SETTINGS: server attempted to disable SETTINGS_ENABLE_CONNECT_PROTOCOL"
                              );
            return iVar2;
          }
          (session->remote_settings).enable_connect_protocol = pnVar1->value;
          break;
        case 9:
          if ((pnVar1->value != 0) && (pnVar1->value != 1)) {
            iVar2 = session_handle_invalid_connection
                              (session,frame,-0x1f9,
                               "SETTINGS: invalid SETTINGS_NO_RFC7540_PRIORITIES");
            return iVar2;
          }
          if (((session->remote_settings).no_rfc7540_priorities != 0xffffffff) &&
             ((session->remote_settings).no_rfc7540_priorities != pnVar1->value)) {
            iVar2 = session_handle_invalid_connection
                              (session,frame,-0x1f9,
                               "SETTINGS: SETTINGS_NO_RFC7540_PRIORITIES cannot be changed");
            return iVar2;
          }
          (session->remote_settings).no_rfc7540_priorities = pnVar1->value;
        }
      }
      if (((((session->remote_settings).no_rfc7540_priorities == 0xffffffff) &&
           ((session->remote_settings).no_rfc7540_priorities = 0, session->server != '\0')) &&
          (session->pending_no_rfc7540_priorities != '\0')) && ((session->opt_flags & 0x20) != 0)) {
        session->fallback_rfc7540_priorities = '\x01';
      }
      if (((noack == 0) && (iVar2 = session_is_closing(session), iVar2 == 0)) &&
         (session_local._4_4_ =
               nghttp2_session_add_settings(session,'\x01',(nghttp2_settings_entry *)0x0,0),
         session_local._4_4_ != 0)) {
        iVar2 = nghttp2_is_fatal(session_local._4_4_);
        if (iVar2 == 0) {
          session_local._4_4_ = session_handle_invalid_connection(session,frame,-0x216,(char *)0x0);
        }
      }
      else {
        session_local._4_4_ = session_call_on_frame_received(session,frame);
      }
    }
    else if ((frame->data).padlen == 0) {
      settings_00 = session->inflight_settings_head;
      if (settings_00 == (nghttp2_inflight_settings *)0x0) {
        session_local._4_4_ =
             session_handle_invalid_connection(session,frame,-0x1f9,"SETTINGS: unexpected ACK");
      }
      else {
        session_local._4_4_ =
             nghttp2_session_update_local_settings(session,settings_00->iv,settings_00->niv);
        session->inflight_settings_head = settings_00->next;
        inflight_settings_del(settings_00,&session->mem);
        if (session_local._4_4_ == 0) {
          session_local._4_4_ = session_call_on_frame_received(session,frame);
        }
        else {
          iVar2 = nghttp2_is_fatal(session_local._4_4_);
          if (iVar2 == 0) {
            session_local._4_4_ =
                 session_handle_invalid_connection(session,frame,session_local._4_4_,(char *)0x0);
          }
        }
      }
    }
    else {
      session_local._4_4_ =
           session_handle_invalid_connection(session,frame,-0x20a,"SETTINGS: ACK and payload != 0");
    }
  }
  else {
    session_local._4_4_ =
         session_handle_invalid_connection(session,frame,-0x1f9,"SETTINGS: stream_id != 0");
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_on_settings_received(nghttp2_session *session,
                                         nghttp2_frame *frame, int noack) {
  int rv;
  size_t i;
  nghttp2_mem *mem;
  nghttp2_inflight_settings *settings;

  mem = &session->mem;

  if (frame->hd.stream_id != 0) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "SETTINGS: stream_id != 0");
  }
  if (frame->hd.flags & NGHTTP2_FLAG_ACK) {
    if (frame->settings.niv != 0) {
      return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_FRAME_SIZE_ERROR,
          "SETTINGS: ACK and payload != 0");
    }

    settings = session->inflight_settings_head;

    if (!settings) {
      return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_PROTO, "SETTINGS: unexpected ACK");
    }

    rv = nghttp2_session_update_local_settings(session, settings->iv,
                                               settings->niv);

    session->inflight_settings_head = settings->next;

    inflight_settings_del(settings, mem);

    if (rv != 0) {
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }
      return session_handle_invalid_connection(session, frame, rv, NULL);
    }
    return session_call_on_frame_received(session, frame);
  }

  if (!session->remote_settings_received) {
    session->remote_settings.max_concurrent_streams =
        NGHTTP2_DEFAULT_MAX_CONCURRENT_STREAMS;
    session->remote_settings_received = 1;
  }

  for (i = 0; i < frame->settings.niv; ++i) {
    nghttp2_settings_entry *entry = &frame->settings.iv[i];

    switch (entry->settings_id) {
    case NGHTTP2_SETTINGS_HEADER_TABLE_SIZE:

      rv = nghttp2_hd_deflate_change_table_size(&session->hd_deflater,
                                                entry->value);
      if (rv != 0) {
        if (nghttp2_is_fatal(rv)) {
          return rv;
        } else {
          return session_handle_invalid_connection(
              session, frame, NGHTTP2_ERR_HEADER_COMP, NULL);
        }
      }

      session->remote_settings.header_table_size = entry->value;

      break;
    case NGHTTP2_SETTINGS_ENABLE_PUSH:

      if (entry->value != 0 && entry->value != 1) {
        return session_handle_invalid_connection(
            session, frame, NGHTTP2_ERR_PROTO,
            "SETTINGS: invalid SETTINGS_ENBLE_PUSH");
      }

      if (!session->server && entry->value != 0) {
        return session_handle_invalid_connection(
            session, frame, NGHTTP2_ERR_PROTO,
            "SETTINGS: server attempted to enable push");
      }

      session->remote_settings.enable_push = entry->value;

      break;
    case NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS:

      session->remote_settings.max_concurrent_streams = entry->value;

      break;
    case NGHTTP2_SETTINGS_INITIAL_WINDOW_SIZE:

      /* Update the initial window size of the all active streams */
      /* Check that initial_window_size < (1u << 31) */
      if (entry->value > NGHTTP2_MAX_WINDOW_SIZE) {
        return session_handle_invalid_connection(
            session, frame, NGHTTP2_ERR_FLOW_CONTROL,
            "SETTINGS: too large SETTINGS_INITIAL_WINDOW_SIZE");
      }

      rv = session_update_remote_initial_window_size(session,
                                                     (int32_t)entry->value);

      if (nghttp2_is_fatal(rv)) {
        return rv;
      }

      if (rv != 0) {
        return session_handle_invalid_connection(
            session, frame, NGHTTP2_ERR_FLOW_CONTROL, NULL);
      }

      session->remote_settings.initial_window_size = entry->value;

      break;
    case NGHTTP2_SETTINGS_MAX_FRAME_SIZE:

      if (entry->value < NGHTTP2_MAX_FRAME_SIZE_MIN ||
          entry->value > NGHTTP2_MAX_FRAME_SIZE_MAX) {
        return session_handle_invalid_connection(
            session, frame, NGHTTP2_ERR_PROTO,
            "SETTINGS: invalid SETTINGS_MAX_FRAME_SIZE");
      }

      session->remote_settings.max_frame_size = entry->value;

      break;
    case NGHTTP2_SETTINGS_MAX_HEADER_LIST_SIZE:

      session->remote_settings.max_header_list_size = entry->value;

      break;
    case NGHTTP2_SETTINGS_ENABLE_CONNECT_PROTOCOL:

      if (entry->value != 0 && entry->value != 1) {
        return session_handle_invalid_connection(
            session, frame, NGHTTP2_ERR_PROTO,
            "SETTINGS: invalid SETTINGS_ENABLE_CONNECT_PROTOCOL");
      }

      if (!session->server &&
          session->remote_settings.enable_connect_protocol &&
          entry->value == 0) {
        return session_handle_invalid_connection(
            session, frame, NGHTTP2_ERR_PROTO,
            "SETTINGS: server attempted to disable "
            "SETTINGS_ENABLE_CONNECT_PROTOCOL");
      }

      session->remote_settings.enable_connect_protocol = entry->value;

      break;
    case NGHTTP2_SETTINGS_NO_RFC7540_PRIORITIES:

      if (entry->value != 0 && entry->value != 1) {
        return session_handle_invalid_connection(
            session, frame, NGHTTP2_ERR_PROTO,
            "SETTINGS: invalid SETTINGS_NO_RFC7540_PRIORITIES");
      }

      if (session->remote_settings.no_rfc7540_priorities != UINT32_MAX &&
          session->remote_settings.no_rfc7540_priorities != entry->value) {
        return session_handle_invalid_connection(
            session, frame, NGHTTP2_ERR_PROTO,
            "SETTINGS: SETTINGS_NO_RFC7540_PRIORITIES cannot be changed");
      }

      session->remote_settings.no_rfc7540_priorities = entry->value;

      break;
    }
  }

  if (session->remote_settings.no_rfc7540_priorities == UINT32_MAX) {
    session->remote_settings.no_rfc7540_priorities = 0;

    if (session->server && session->pending_no_rfc7540_priorities &&
        (session->opt_flags &
         NGHTTP2_OPTMASK_SERVER_FALLBACK_RFC7540_PRIORITIES)) {
      session->fallback_rfc7540_priorities = 1;
    }
  }

  if (!noack && !session_is_closing(session)) {
    rv = nghttp2_session_add_settings(session, NGHTTP2_FLAG_ACK, NULL, 0);

    if (rv != 0) {
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }

      return session_handle_invalid_connection(session, frame,
                                               NGHTTP2_ERR_INTERNAL, NULL);
    }
  }

  return session_call_on_frame_received(session, frame);
}